

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cEnhancedLayoutsTests.cpp
# Opt level: O3

string * __thiscall
gl4cts::EnhancedLayouts::XFBInvalidOffsetAlignmentTest::getTestCaseName_abi_cxx11_
          (string *__return_storage_ptr__,XFBInvalidOffsetAlignmentTest *this,GLuint test_case_index
          )

{
  pointer ptVar1;
  GLchar *pGVar2;
  size_t sVar3;
  stringstream stream;
  stringstream local_1b0 [16];
  undefined1 local_1a0 [376];
  
  std::__cxx11::stringstream::stringstream(local_1b0);
  ptVar1 = (this->m_test_cases).
           super__Vector_base<gl4cts::EnhancedLayouts::XFBInvalidOffsetAlignmentTest::testCase,_std::allocator<gl4cts::EnhancedLayouts::XFBInvalidOffsetAlignmentTest::testCase>_>
           ._M_impl.super__Vector_impl_data._M_start;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"Stage: ",7);
  pGVar2 = Utils::Shader::GetStageName(ptVar1[test_case_index].m_stage);
  sVar3 = strlen(pGVar2);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,pGVar2,sVar3);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,", type: ",8);
  pGVar2 = Utils::Type::GetGLSLTypeName(&ptVar1[test_case_index].m_type);
  if (pGVar2 == (GLchar *)0x0) {
    std::ios::clear((int)(ostream *)local_1a0 + (int)*(_func_int **)(local_1a0._0_8_ + -0x18));
  }
  else {
    sVar3 = strlen(pGVar2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,pGVar2,sVar3);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,", offset: ",10);
  std::ostream::_M_insert<unsigned_long>((ulong)local_1a0);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b0);
  std::ios_base::~ios_base((ios_base *)(local_1a0 + 0x70));
  return __return_storage_ptr__;
}

Assistant:

std::string XFBInvalidOffsetAlignmentTest::getTestCaseName(GLuint test_case_index)
{
	std::stringstream stream;
	testCase&		  test_case = m_test_cases[test_case_index];

	stream << "Stage: " << Utils::Shader::GetStageName(test_case.m_stage)
		   << ", type: " << test_case.m_type.GetGLSLTypeName() << ", offset: " << test_case.m_offset;

	return stream.str();
}